

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong uVar11;
  ImGuiShrinkWidthItem *pIVar12;
  long in_R8;
  long unaff_R12;
  long unaff_R13;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 in_XMM17 [16];
  undefined1 auVar15 [32];
  
  if (count == 1) {
    auVar1 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
    items->Width = auVar1._0_4_;
  }
  else {
    pIVar12 = items;
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar11 = extraout_RDX;
    if (1 < count) {
      auVar1 = vucomiss_avx512f(ZEXT816(0) << 0x40);
      if (2 < (uint)count) {
        lVar9 = 1;
        auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar20 = vpbroadcastq_avx512f();
        auVar21 = vpbroadcastq_avx512f(ZEXT816(0x10));
        do {
          lVar9 = (long)(int)lVar9;
          do {
            if (items[lVar9].Width < items->Width) {
              fVar29 = items->Width - items[lVar9].Width;
              goto LAB_00253897;
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < (long)(ulong)(uint)count);
          fVar29 = items->Width + -1.0;
LAB_00253897:
          uVar8 = (uint)lVar9;
          auVar2 = vcvtsi2ss_avx512f(in_XMM17,uVar8);
          auVar13 = vdivss_avx512f(auVar1,auVar2);
          auVar13 = vminss_avx(auVar13,ZEXT416((uint)fVar29));
          if (0 < (int)uVar8) {
            uVar11 = (ulong)(uVar8 + 0xf & 0xfffffff0);
            auVar22 = vpbroadcastq_avx512f();
            auVar23 = vbroadcastss_avx512f(auVar13);
            auVar24 = vmovdqa64_avx512f(auVar19);
            auVar25 = vmovdqa64_avx512f(auVar18);
            do {
              uVar10 = vpcmpuq_avx512f(auVar24,auVar22,2);
              uVar4 = vpcmpuq_avx512f(auVar25,auVar22,2);
              auVar26 = vpsllq_avx512f(auVar24,3);
              auVar26 = vpaddq_avx512f(auVar20,auVar26);
              auVar27 = vpsllq_avx512f(auVar25,3);
              auVar27 = vpaddq_avx512f(auVar20,auVar27);
              auVar14 = vgatherqps_avx512f(*(undefined8 *)(unaff_R13 + 4));
              auVar15._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar14._8_8_;
              auVar15._0_8_ = (ulong)((byte)uVar4 & 1) * auVar14._0_8_;
              auVar15._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar14._16_8_;
              auVar15._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar14._24_8_;
              auVar14 = vgatherqps_avx512f(*(undefined8 *)(unaff_R12 + 4));
              auVar28 = vinsertf64x4_avx512f
                                  (ZEXT3264(CONCAT824((ulong)((byte)(uVar10 >> 3) & 1) *
                                                      auVar14._24_8_,
                                                      CONCAT816((ulong)((byte)(uVar10 >> 2) & 1) *
                                                                auVar14._16_8_,
                                                                CONCAT88((ulong)((byte)(uVar10 >> 1)
                                                                                & 1) * auVar14._8_8_
                                                                         ,(ulong)((byte)uVar10 & 1)
                                                                          * auVar14._0_8_)))),
                                   auVar15,1);
              auVar28 = vsubps_avx512f(auVar28,auVar23);
              vscatterqps_avx512f(ZEXT864(4) + auVar26,uVar10,auVar28._0_32_);
              auVar14 = vextractf64x4_avx512f(auVar28,1);
              vscatterqps_avx512f(ZEXT864(4) + auVar27,uVar4,auVar14);
              auVar24 = vpaddq_avx512f(auVar24,auVar21);
              auVar25 = vpaddq_avx512f(auVar25,auVar21);
              uVar11 = uVar11 - 0x10;
            } while (uVar11 != 0);
          }
          if (count <= (int)uVar8) break;
          vfnmadd231ss_avx512f(auVar1,auVar13,auVar2);
          auVar1 = vucomiss_avx512f(ZEXT816(0) << 0x40);
        } while ((uint)count < uVar8);
      }
    }
    fVar29 = 0.0;
    if (0 < count) {
      uVar10 = 0;
      fVar29 = 0.0;
      do {
        auVar1 = vcvtdq2ps_avx(ZEXT416((uint)(int)items[uVar10].Width));
        fVar29 = fVar29 + (items[uVar10].Width - auVar1._0_4_);
        items[uVar10].Width = auVar1._0_4_;
        uVar10 = uVar10 + 1;
      } while ((uint)count != uVar10);
    }
    if (count >= 1 && fVar29 > 0.0) {
      uVar10 = (ulong)(count + 0xfU & 0xfffffff0);
      auVar18 = vpbroadcastq_avx512f();
      auVar19 = vpbroadcastd_avx512f();
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar24 = vpbroadcastq_avx512f(ZEXT816(0x10));
      do {
        uVar4 = vpcmpuq_avx512f(auVar20,auVar18,2);
        uVar5 = vpcmpuq_avx512f(auVar21,auVar18,2);
        auVar25 = vpsllq_avx512f(auVar21,3);
        auVar25 = vpaddq_avx512f(auVar22,auVar25);
        auVar26 = vpsllq_avx512f(auVar20,3);
        auVar26 = vpaddq_avx512f(auVar22,auVar26);
        auVar14 = vpgatherqd_avx512f(*(undefined8 *)((long)items * 9));
        auVar15 = vpgatherqd_avx512f(items[CONCAT71((int7)(uVar11 >> 8),count < 1 || fVar29 <= 0.0)]
                                    );
        auVar16._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar15._4_4_;
        auVar16._0_4_ = (uint)((byte)uVar4 & 1) * auVar15._0_4_;
        auVar16._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar15._8_4_;
        auVar16._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar15._12_4_;
        auVar16._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar15._16_4_;
        auVar16._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar15._20_4_;
        auVar16._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar15._24_4_;
        auVar16._28_4_ = (uint)(byte)(uVar4 >> 7) * auVar15._28_4_;
        auVar27 = vinserti64x4_avx512f
                            (ZEXT3264(CONCAT428((uint)(byte)(uVar5 >> 7) * auVar14._28_4_,
                                                CONCAT424((uint)((byte)(uVar5 >> 6) & 1) *
                                                          auVar14._24_4_,
                                                          CONCAT420((uint)((byte)(uVar5 >> 5) & 1) *
                                                                    auVar14._20_4_,
                                                                    CONCAT416((uint)((byte)(uVar5 >>
                                                                                           4) & 1) *
                                                                              auVar14._16_4_,
                                                                              CONCAT412((uint)((byte
                                                  )(uVar5 >> 3) & 1) * auVar14._12_4_,
                                                  CONCAT48((uint)((byte)(uVar5 >> 2) & 1) *
                                                           auVar14._8_4_,
                                                           CONCAT44((uint)((byte)(uVar5 >> 1) & 1) *
                                                                    auVar14._4_4_,
                                                                    (uint)((byte)uVar5 & 1) *
                                                                    auVar14._0_4_)))))))),auVar16,1)
        ;
        uVar3 = vpcmpgtd_avx512f(auVar19,auVar27);
        bVar6 = (byte)uVar4 & (byte)((ulong)uVar3 >> 8);
        auVar14 = vgatherqps_avx512f(*(undefined8 *)(in_R8 + 4));
        auVar17._8_8_ = (ulong)(bVar6 >> 1 & 1) * auVar14._8_8_;
        auVar17._0_8_ = (ulong)(bVar6 & 1) * auVar14._0_8_;
        auVar17._16_8_ = (ulong)(bVar6 >> 2 & 1) * auVar14._16_8_;
        auVar17._24_8_ = (ulong)(bVar6 >> 3 & 1) * auVar14._24_8_;
        bVar7 = (byte)uVar5 & (byte)uVar3;
        auVar14 = vgatherqps_avx512f(*(undefined8 *)&pIVar12->Width);
        auVar27 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT824((ulong)(bVar7 >> 3 & 1) * auVar14._24_8_,
                                                CONCAT816((ulong)(bVar7 >> 2 & 1) * auVar14._16_8_,
                                                          CONCAT88((ulong)(bVar7 >> 1 & 1) *
                                                                   auVar14._8_8_,
                                                                   (ulong)(bVar7 & 1) *
                                                                   auVar14._0_8_)))),auVar17,1);
        auVar27 = vaddps_avx512f(auVar27,auVar23);
        vscatterqps_avx512f(ZEXT864(4) + auVar25,(ulong)bVar7,auVar27._0_32_);
        auVar14 = vextractf64x4_avx512f(auVar27,1);
        vscatterqps_avx512f(ZEXT864(4) + auVar26,(ulong)bVar6,auVar14);
        auVar21 = vpaddq_avx512f(auVar21,auVar24);
        auVar20 = vpaddq_avx512f(auVar20,auVar24);
        uVar10 = uVar10 - 0x10;
      } while (uVar10 != 0);
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}